

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalNinjaGenerator::AppendTargetOutputs
          (cmGlobalNinjaGenerator *this,cmGeneratorTarget *target,cmNinjaDeps *outputs,
          cmNinjaTargetDepends depends)

{
  TargetType TVar1;
  cmMakefile *this_00;
  string *psVar2;
  cmLocalGenerator *this_01;
  allocator<char> local_141;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  undefined1 local_100 [8];
  string path;
  string local_c0;
  string local_a0;
  byte local_7d;
  bool realname;
  allocator<char> local_69;
  string local_68;
  undefined1 local_48 [8];
  string configName;
  cmNinjaTargetDepends depends_local;
  cmNinjaDeps *outputs_local;
  cmGeneratorTarget *target_local;
  cmGlobalNinjaGenerator *this_local;
  
  configName.field_2._12_4_ = depends;
  this_00 = cmTarget::GetMakefile(target->Target);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"CMAKE_BUILD_TYPE",&local_69);
  psVar2 = cmMakefile::GetSafeDefinition(this_00,&local_68);
  std::__cxx11::string::string((string *)local_48,(string *)psVar2);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  local_7d = cmGeneratorTarget::IsFrameworkOnApple(target);
  TVar1 = cmGeneratorTarget::GetType(target);
  switch(TVar1) {
  case STATIC_LIBRARY:
  case SHARED_LIBRARY:
  case MODULE_LIBRARY:
    if (configName.field_2._12_4_ == 1) {
      OrderDependsTargetForTarget_abi_cxx11_(&local_a0,target);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(outputs,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      break;
    }
  case EXECUTABLE:
    cmGeneratorTarget::GetFullPath
              (&local_c0,target,(string *)local_48,RuntimeBinaryArtifact,(bool)(local_7d & 1));
    psVar2 = ConvertToNinjaPath(this,&local_c0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(outputs,psVar2);
    std::__cxx11::string::~string((string *)&local_c0);
    break;
  case OBJECT_LIBRARY:
    if (configName.field_2._12_4_ == 1) {
      OrderDependsTargetForTarget_abi_cxx11_((string *)((long)&path.field_2 + 8),target);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(outputs,(value_type *)((long)&path.field_2 + 8));
      std::__cxx11::string::~string((string *)(path.field_2._M_local_buf + 8));
      break;
    }
  case UTILITY:
  case GLOBAL_TARGET:
    this_01 = cmGeneratorTarget::GetLocalGenerator(target);
    psVar2 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this_01);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"/",&local_141);
    std::operator+(&local_120,psVar2,&local_140);
    psVar2 = cmGeneratorTarget::GetName_abi_cxx11_(target);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
                   &local_120,psVar2);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_140);
    std::allocator<char>::~allocator(&local_141);
    psVar2 = ConvertToNinjaPath(this,(string *)local_100);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(outputs,psVar2);
    std::__cxx11::string::~string((string *)local_100);
  }
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::AppendTargetOutputs(
  cmGeneratorTarget const* target, cmNinjaDeps& outputs,
  cmNinjaTargetDepends depends)
{
  std::string configName =
    target->Target->GetMakefile()->GetSafeDefinition("CMAKE_BUILD_TYPE");

  // for frameworks, we want the real name, not smple name
  // frameworks always appear versioned, and the build.ninja
  // will always attempt to manage symbolic links instead
  // of letting cmOSXBundleGenerator do it.
  bool realname = target->IsFrameworkOnApple();

  switch (target->GetType()) {
    case cmStateEnums::SHARED_LIBRARY:
    case cmStateEnums::STATIC_LIBRARY:
    case cmStateEnums::MODULE_LIBRARY: {
      if (depends == DependOnTargetOrdering) {
        outputs.push_back(OrderDependsTargetForTarget(target));
        break;
      }
    }
    // FALLTHROUGH
    case cmStateEnums::EXECUTABLE: {
      outputs.push_back(this->ConvertToNinjaPath(target->GetFullPath(
        configName, cmStateEnums::RuntimeBinaryArtifact, realname)));
      break;
    }
    case cmStateEnums::OBJECT_LIBRARY: {
      if (depends == DependOnTargetOrdering) {
        outputs.push_back(OrderDependsTargetForTarget(target));
        break;
      }
    }
    // FALLTHROUGH
    case cmStateEnums::GLOBAL_TARGET:
    case cmStateEnums::UTILITY: {
      std::string path =
        target->GetLocalGenerator()->GetCurrentBinaryDirectory() +
        std::string("/") + target->GetName();
      outputs.push_back(this->ConvertToNinjaPath(path));
      break;
    }

    default:
      return;
  }
}